

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Var *out_type)

{
  char cVar1;
  Enum index;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  long lVar5;
  long *plVar6;
  Type type;
  Token token;
  Type local_1b0;
  size_t local_1a8;
  char *pcStack_1a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [32];
  undefined1 *local_168;
  undefined1 local_158 [16];
  string local_148 [16];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  Token local_88;
  Location local_48;
  
  if (((this->options_->features).function_references_enabled_ == false) &&
     ((this->options_->features).exceptions_enabled_ != true)) {
    TVar3 = Peek(this,0);
    if (TVar3 != First_Type) {
LAB_0018e1cd:
      local_188._0_8_ = local_188 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"i32","");
      local_168 = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"i64","");
      local_148._0_8_ = local_138;
      std::__cxx11::string::_M_construct<char_const*>(local_148,"f32","");
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"f64","");
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"v128","");
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"externref","");
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"exnref","");
      plVar6 = local_98;
      local_a8[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"funcref","");
      local_88.loc.filename._M_len = 0;
      local_88.loc.filename._M_str = (char *)0x0;
      local_88.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_188,&local_88);
      RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      lVar5 = -0x100;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      return (Result)RVar4.enum_;
    }
  }
  else {
    bVar2 = PeekMatchLpar(this,Ref);
    TVar3 = Peek(this,0);
    if ((!bVar2) && (TVar3 != First_Type)) goto LAB_0018e1cd;
    if (bVar2) {
      RVar4 = Expect(this,Lpar);
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
      RVar4 = Expect(this,Ref);
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
      RVar4 = ParseVar(this,out_type);
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
      RVar4 = Expect(this,Rpar);
      return (Result)(uint)(RVar4.enum_ == Error);
    }
  }
  Consume(&local_88,this);
  if (3 < local_88.token_type_ - First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                  ,0x68,"Type wabt::Token::type() const");
  }
  local_1b0.enum_ = local_88.field_2.type_.enum_;
  local_1b0.type_index_ = local_88.field_2.type_.type_index_;
  index = local_88.field_2.type_.enum_;
  if ((uint)(index + 0x11) < 2) {
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  else if (index == ExnRef) {
    cVar1 = (this->options_->features).exceptions_enabled_;
  }
  else {
    if (index != V128) goto LAB_0018e377;
    cVar1 = (this->options_->features).simd_enabled_;
  }
  if (cVar1 == '\0') {
    local_198.offset = (size_t)local_88.loc.field_1.field_1.offset;
    uStack_190 = local_88.loc.field_1._8_8_;
    local_1a8 = local_88.loc.filename._M_len;
    pcStack_1a0 = local_88.loc.filename._M_str;
    Type::GetName_abi_cxx11_((string *)local_188,&local_1b0);
    Error(this,0x1f8864,(char *)local_188._0_8_);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
    return (Result)Error;
  }
LAB_0018e377:
  GetToken((Token *)local_188,this);
  local_48.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_188._16_8_;
  local_48.field_1._8_8_ = local_188._24_8_;
  local_48.filename._M_len = local_188._0_8_;
  local_48.filename._M_str = (char *)local_188._8_8_;
  Var::Var((Var *)local_188,index,&local_48);
  Var::operator=(out_type,(Var *)local_188);
  Var::~Var((Var *)local_188);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueType(Var* out_type) {
  WABT_TRACE(ParseValueType);

  const bool is_ref_type = PeekMatchRefType();
  const bool is_value_type = PeekMatch(TokenType::ValueType);

  if (!is_value_type && !is_ref_type) {
    return ErrorExpected(
        {"i32", "i64", "f32", "f64", "v128", "externref", "exnref", "funcref"});
  }

  if (is_ref_type) {
    EXPECT(Lpar);
    EXPECT(Ref);
    CHECK_RESULT(ParseVar(out_type));
    EXPECT(Rpar);
    return Result::Ok;
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    case Type::ExnRef:
      is_enabled = options_->features.exceptions_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = Var(type, GetLocation());
  return Result::Ok;
}